

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindEQ(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
                   BpTree<int> *this,int k)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Addr Cp;
  IndexNode<int> C;
  Addr local_98;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = FindFirstKey(this,k,&local_98);
  FindNode(this,local_98,&local_90);
  if (iVar2 == -1) {
LAB_001298d1:
    IndexNode<int>::~IndexNode(&local_90);
    return __return_storage_ptr__;
  }
  lVar7 = (long)iVar2;
  do {
    lVar5 = lVar7 * 8;
    lVar6 = lVar7 << 0x20;
    lVar8 = lVar7;
    while( true ) {
      while( true ) {
        lVar3 = (long)this->N;
        if (((lVar3 + -1 <= lVar8) ||
            (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8] != '1')) ||
           (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar8] != k)) break;
        std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
        _M_insert_unique<Addr_const&>
                  ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                   __return_storage_ptr__,
                   (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar5));
        lVar5 = lVar5 + 8;
        lVar6 = lVar6 + 0x100000000;
        lVar8 = lVar8 + 1;
      }
      if ((int)lVar8 == (int)(lVar3 + -1)) break;
      lVar4 = lVar6 >> 0x20;
      if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar4] == '0') {
        if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3 + -1].FileOff == -1) goto LAB_001298d1;
        if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] == '0') goto LAB_001298b7;
      }
      lVar5 = lVar7 * 8;
      lVar6 = lVar7 << 0x20;
      lVar8 = lVar7;
      if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar4] != k) goto LAB_001298d1;
    }
    if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3 + -1].FileOff == -1) goto LAB_001298d1;
LAB_001298b7:
    FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3 + -1],&local_90);
    lVar7 = 0;
  } while( true );
}

Assistant:

set<Addr> BpTree<K>::FindEQ(K k) {
	IndexNode<K> C(N);
	Addr Cp;
	int i;
	set<Addr> ret;
	int pos = this->FindFirstKey(k, Cp);
	this->FindNode(Cp, C);			//C.k[pos]�ǵ�һ����ֵΪk�ĵط�
	if (pos == -1)
		return ret;					//�Ҳ����ü�ֵ�����ؿ�����
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] == k; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;									//��ͷ��
		}
		else if (i == N - 1 || C.v[i] == '0') {		//��Ҷ���������һ�����
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
		else if (C.k[i] != k) {
			break;									//�ҵ���һ���������������λ��
		}
	}
	return ret;
}